

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

int __thiscall
Timer::
run_repeated<void(&)(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,int),std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,int&>
          (Timer *this,int ms_time,int repeated_num,
          _func_void_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_int
          *f,time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             *args,int *args_1)

{
  int iVar1;
  undefined1 local_e0 [8];
  unique_lock<std::mutex> lock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b8;
  duration local_b0;
  duration<long,std::ratio<1l,1000l>> local_a8 [28];
  IdState local_8c;
  undefined1 local_88 [8];
  TimerNode s;
  int *args_local_1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *args_local;
  _func_void_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_int
  *f_local;
  int repeated_num_local;
  int ms_time_local;
  Timer *this_local;
  undefined4 local_18;
  undefined4 local_14;
  atomic<int> *local_10;
  
  s.tn_period.__r = (rep)args_1;
  f_local._0_4_ = repeated_num;
  f_local._4_4_ = ms_time;
  _repeated_num_local = this;
  TimerNode::TimerNode((TimerNode *)local_88);
  local_10 = &this->tm_id;
  local_14 = 1;
  local_18 = 5;
  this_local._4_4_ = 1;
  LOCK();
  s.tn_callback._M_invoker._4_4_ = (local_10->super___atomic_base<int>)._M_i;
  (local_10->super___atomic_base<int>)._M_i = (local_10->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_8c = Running;
  this_local._0_4_ = s.tn_callback._M_invoker._4_4_;
  hash_map<int,_Timer::IdState>::emplace
            (&this->tm_id_state_map,(int *)((long)&s.tn_callback._M_invoker + 4),&local_8c);
  s.tn_id._1_1_ = 1;
  s.repeated_id = (int)f_local;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            (local_a8,(int *)((long)&f_local + 4));
  s._48_8_ = local_a8._0_8_;
  local_b8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_b0.__r = (rep)std::chrono::operator+
                                (&local_b8,
                                 (duration<long,_std::ratio<1L,_1000L>_> *)&s.tn_repeated_num);
  local_88 = (undefined1  [8])local_b0.__r;
  std::
  bind<void(&)(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,int),std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,int&>
            ((type *)&lock._M_owns,f,args,(int *)s.tn_period.__r);
  std::function<void()>::operator=
            ((function<void()> *)&s,
             (_Bind<void_(*(std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int))(std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int)>
              *)&lock._M_owns);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_e0,&this->tm_mutex);
  std::
  priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
  ::push(&this->tm_queue,(value_type *)local_88);
  std::condition_variable::notify_all();
  iVar1 = s.tn_callback._M_invoker._4_4_;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e0);
  TimerNode::~TimerNode((TimerNode *)local_88);
  return iVar1;
}

Assistant:

int run_repeated(int ms_time, int repeated_num, F&& f, Args&&... args)
    {
        TimerNode s;
        s.tn_id = tm_id.fetch_add(1);
        tm_id_state_map.emplace(s.tn_id, IdState::Running);
        s.tn_is_repeated = true;
        s.tn_repeated_num = repeated_num;
        s.tn_period = chrono::milliseconds(ms_time);
        s.tn_tm_point = chrono::high_resolution_clock::now() + s.tn_period;
        // TODO: use lamda, tuple and apply of C++17 replacing bind
        s.tn_callback = bind(forward<F>(f), forward<Args>(args)...);
        unique_lock<mutex> lock(tm_mutex);
        tm_queue.push(s);
        tm_cond.notify_all();   

        return s.tn_id; 
    }